

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

bool google::protobuf::internal::IsDescendant(Message *root,Message *message)

{
  byte bVar1;
  FieldDescriptor *this;
  TaggedPtr p;
  bool bVar2;
  int iVar3;
  Message *pMVar4;
  Descriptor *pDVar5;
  ReflectionPayload *pRVar6;
  Nonnull<const_char_*> pcVar7;
  Reflection *this_00;
  char cVar8;
  pointer ppFVar9;
  int index;
  Metadata MVar10;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  bool local_f9;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_e8;
  pointer local_c8;
  MapIterator local_c0;
  MapIterator local_78;
  
  MVar10 = Message::GetMetadata(root);
  this_00 = MVar10.reflection;
  local_e8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_00,root,&local_e8);
  local_c8 = local_e8.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_f9 = local_e8.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_e8.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar9 = local_e8.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_f9) {
    do {
      this = *ppFVar9;
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4) == 10) {
        bVar1 = this->field_0x1;
        bVar2 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar2) {
          pcVar7 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                             (bVar2,0xbf < bVar1,
                              "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar7 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar7);
LAB_002a965e:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_78);
        }
        if ((this->field_0x1 & 0x20) == 0) {
          pMVar4 = Reflection::MutableMessage(this_00,root,this,(MessageFactory *)0x0);
          if (pMVar4 == message) {
            cVar8 = '\x01';
          }
          else {
            bVar2 = IsDescendant(pMVar4,message);
            cVar8 = !bVar2 * '\x02' + '\x01';
          }
        }
        else {
          if ((this->type_ != '\v') || (bVar2 = FieldDescriptor::is_map_message_type(this), !bVar2))
          {
            iVar3 = Reflection::FieldSize(this_00,root,this);
            if (0 < iVar3) {
              index = 0;
              do {
                pMVar4 = Reflection::MutableRepeatedMessage(this_00,root,this,index);
                cVar8 = '\x01';
                if ((pMVar4 == message) || (bVar2 = IsDescendant(pMVar4,message), bVar2))
                goto LAB_002a95b6;
                index = index + 1;
              } while (iVar3 != index);
            }
            goto LAB_002a95b1;
          }
          pDVar5 = FieldDescriptor::message_type(this);
          if ((long)pDVar5->field_count_ < 2) {
            pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (1,(long)pDVar5->field_count_,"index < field_count()");
          }
          else {
            pcVar7 = (Nonnull<const_char_*>)0x0;
          }
          if (pcVar7 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_78,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar7);
            goto LAB_002a965e;
          }
          cVar8 = '\x03';
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pDVar5->fields_[1].type_ * 4) ==
              10) {
            Reflection::MapEnd(&local_78,this_00,root,this);
            Reflection::MapBegin(&local_c0,this_00,root,this);
            while (bVar2 = MapFieldBase::EqualIterator(local_c0.map_,&local_c0,&local_78), !bVar2) {
              p = ((local_c0.map_)->super_MapFieldBaseForParse).payload_._M_i;
              if ((p & 1) == 0) {
                pRVar6 = (ReflectionPayload *)0x0;
              }
              else {
                pRVar6 = MapFieldBase::ToPayload(p);
              }
              if (pRVar6 != (ReflectionPayload *)0x0) {
                (pRVar6->state)._M_i = STATE_MODIFIED_MAP;
              }
              pMVar4 = MapValueRef::MutableMessageValue(&local_c0.value_);
              cVar8 = '\x01';
              if ((pMVar4 == message) || (bVar2 = IsDescendant(pMVar4,message), bVar2))
              goto LAB_002a95b6;
              MapFieldBase::IncreaseIterator(local_c0.map_,&local_c0);
            }
            cVar8 = '\0';
          }
        }
      }
      else {
LAB_002a95b1:
        cVar8 = '\x03';
      }
LAB_002a95b6:
      if ((cVar8 != '\x03') && (cVar8 != '\0')) break;
      local_f9 = ppFVar9 + 1 != local_c8;
      ppFVar9 = ppFVar9 + 1;
    } while (local_f9);
  }
  if (local_e8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_f9;
}

Assistant:

bool IsDescendant(Message& root, const Message& message) {
  const Reflection* reflection = root.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(root, &fields);

  for (const auto* field : fields) {
    // Skip non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) continue;

    // Optional messages.
    if (!field->is_repeated()) {
      Message* sub_message = reflection->MutableMessage(&root, field);
      if (sub_message == &message || IsDescendant(*sub_message, message)) {
        return true;
      }
      continue;
    }

    // Repeated messages.
    if (!IsMapFieldInApi(field)) {
      int count = reflection->FieldSize(root, field);
      for (int i = 0; i < count; i++) {
        Message* sub_message =
            reflection->MutableRepeatedMessage(&root, field, i);
        if (sub_message == &message || IsDescendant(*sub_message, message)) {
          return true;
        }
      }
      continue;
    }

    // Map field: if accessed as repeated fields, messages are *copied* and
    // matching pointer won't work. Must directly access map.
    constexpr int kValIdx = 1;
    const FieldDescriptor* val_field = field->message_type()->field(kValIdx);
    // Skip map fields whose value type is not message.
    if (val_field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) continue;

    MapIterator end = reflection->MapEnd(&root, field);
    for (auto iter = reflection->MapBegin(&root, field); iter != end; ++iter) {
      Message* sub_message = iter.MutableValueRef()->MutableMessageValue();
      if (sub_message == &message || IsDescendant(*sub_message, message)) {
        return true;
      }
    }
  }

  return false;
}